

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpXmlWriter.c
# Opt level: O1

deBool qpXmlWriter_startDocument(qpXmlWriter *writer)

{
  writer->xmlElementDepth = 0;
  writer->xmlPrevIsStartElement = 0;
  writer->xmlIsWriting = 1;
  fwrite("<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n",0x27,1,(FILE *)writer->outputFile);
  return 1;
}

Assistant:

deBool qpXmlWriter_startDocument (qpXmlWriter* writer)
{
	DE_ASSERT(writer && !writer->xmlIsWriting);
	writer->xmlIsWriting			= DE_TRUE;
	writer->xmlElementDepth			= 0;
	writer->xmlPrevIsStartElement	= DE_FALSE;
	fprintf(writer->outputFile, "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
	return DE_TRUE;
}